

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O1

void __thiscall bloaty::RangeMapTest_Bug1_Test::TestBody(RangeMapTest_Bug1_Test *this)

{
  RangeMap *this_00;
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  allocator_type local_b1;
  undefined1 local_b0 [24];
  string local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 local_70;
  uint64_t local_68;
  long *local_60 [2];
  long local_50 [2];
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> local_40;
  
  pcVar1 = local_b0 + 0x10;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"foo","");
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,100,0x14,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"bar","");
  RangeMap::AddRange(this_00,0x78,0x14,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"baz","");
  RangeMap::AddRange(this_00,100,0xf,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._0_8_ = (pointer)0x64;
  local_b0._8_8_ = 0x78;
  local_b0._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>(local_98,"foo","");
  local_78 = 0x78;
  local_70 = 0x8c;
  local_68 = (this->super_RangeMapTest).kNoTranslation;
  plVar3 = local_50;
  local_60[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"bar","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_b0;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            (&local_40,__l,&local_b1);
  RangeMapTest::AssertMapEquals(&this->super_RangeMapTest,this_00,&local_40);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (&local_40);
  lVar2 = -0x70;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -7;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0);
  return;
}

Assistant:

TEST_F(RangeMapTest, Bug1) {
  map_.AddRange(100, 20, "foo");
  map_.AddRange(120, 20, "bar");
  map_.AddRange(100, 15, "baz");
  AssertMainMapEquals({
    {100, 120, kNoTranslation, "foo"},
    {120, 140, kNoTranslation, "bar"},
  });
}